

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  ulong uVar1;
  pointer pcVar2;
  size_t ilhs;
  size_t irhs;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  for (ilhs = 0; uVar1 = this->num_elements_, ilhs < uVar1; ilhs = ilhs + 1) {
    uVar3 = 0;
    while (uVar3 < this->num_matchers_) {
      lVar4 = this->num_matchers_ * ilhs;
      pcVar2 = (this->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = pcVar2[uVar3 + lVar4] == '\0';
      pcVar2[uVar3 + lVar4] = bVar5;
      uVar3 = uVar3 + 1;
      if (bVar5) goto LAB_001610f0;
    }
  }
LAB_001610f0:
  return ilhs < uVar1;
}

Assistant:

bool MatchMatrix::NextGraph() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      if (!b) {
        b = 1;
        return true;
      }
      b = 0;
    }
  }
  return false;
}